

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void ppu_synchronize(Emulator *e)

{
  u8 *puVar1;
  u32 *puVar2;
  EmulatorEvent *pEVar3;
  u8 uVar4;
  PPUState PVar5;
  ulong uVar6;
  u32 uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar8 = (e->state).ppu.sync_ticks;
  if ((uVar8 & 3) != 0) {
    __assert_fail("IS_ALIGNED(PPU.sync_ticks, CPU_TICK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
                  0xddc,"void ppu_synchronize(Emulator *)");
  }
  uVar13 = (e->state).ticks & 0xfffffffffffffffc;
  if (uVar8 < uVar13) {
    if ((uVar13 != uVar8) && ((e->state).ppu.lcdc.display != FALSE)) {
      iVar11 = 0x1c8 - (int)uVar8;
      do {
        uVar12 = uVar8 + 4;
        puVar1 = &(e->state).interrupt.if_;
        *puVar1 = *puVar1 | (e->state).interrupt.new_if & 3;
        (e->state).ppu.stat.mode2.trigger = FALSE;
        (e->state).ppu.stat.y_compare.trigger = FALSE;
        (e->state).ppu.stat.ly_eq_lyc = (e->state).ppu.stat.new_ly_eq_lyc;
        uVar4 = (e->state).ppu.ly;
        (e->state).ppu.last_ly = uVar4;
        puVar2 = &(e->state).ppu.state_ticks;
        *puVar2 = *puVar2 - 4;
        if (*puVar2 != 0) goto LAB_00110d78;
        PVar5 = (e->state).ppu.state;
        switch(PVar5) {
        case PPU_STATE_HBLANK:
        case PPU_STATE_VBLANK_PLUS_4:
          puVar1 = &(e->state).ppu.line_y;
          *puVar1 = *puVar1 + '\x01';
          (e->state).ppu.ly = uVar4 + '\x01';
          (e->state).ppu.line_start_ticks = uVar8;
          check_ly_eq_lyc(e,FALSE);
          (e->state).ppu.state_ticks = 4;
          PVar5 = (e->state).ppu.state;
          if (PVar5 == PPU_STATE_VBLANK_PLUS_4) {
            if ((e->state).ppu.ly == 0x99) {
              (e->state).ppu.state = PPU_STATE_VBLANK_LY_0;
            }
            else {
              (e->state).ppu.state_ticks = 0x1c8;
            }
          }
          else {
            if (PVar5 != PPU_STATE_HBLANK) {
              __assert_fail("PPU.state == PPU_STATE_VBLANK_PLUS_4",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                            ,0xe11,"void ppu_synchronize(Emulator *)");
            }
            (e->state).ppu.stat.mode2.trigger = TRUE;
            if ((e->state).ppu.ly == 0x90) {
              (e->state).ppu.state = PPU_STATE_VBLANK;
              (e->state).ppu.stat.trigger_mode = PPU_MODE_VBLANK;
              puVar2 = &(e->state).ppu.frame;
              *puVar2 = *puVar2 + 1;
              puVar1 = &(e->state).interrupt.new_if;
              *puVar1 = *puVar1 | 1;
              uVar4 = (e->state).ppu.display_delay_frames;
              if (uVar4 == '\0') {
                pEVar3 = &(e->state).event;
                *(byte *)pEVar3 = (byte)*pEVar3 | 1;
              }
              else {
                (e->state).ppu.display_delay_frames = uVar4 + 0xff;
              }
            }
            else {
              (e->state).ppu.state = PPU_STATE_HBLANK_PLUS_4;
              (e->state).ppu.stat.trigger_mode = PPU_MODE_MODE2;
              if ((e->state).ppu.rendering_window != FALSE) {
                puVar1 = &(e->state).ppu.win_y;
                *puVar1 = *puVar1 + '\x01';
              }
              if (((e->state).hdma.mode == HDMA_TRANSFER_MODE_HDMA) &&
                 (-1 < (char)(e->state).hdma.blocks)) {
                (e->state).hdma.state = DMA_ACTIVE;
              }
            }
          }
          check_stat(e);
          goto switchD_00110daf_default;
        case PPU_STATE_HBLANK_PLUS_4:
          (e->state).ppu.state = PPU_STATE_MODE2;
          (e->state).ppu.state_ticks = 0x50;
          (e->state).ppu.stat.mode = PPU_MODE_MODE2;
          do_ppu_mode2(e);
          goto switchD_00110daf_default;
        case PPU_STATE_VBLANK:
          (e->state).ppu.state = PPU_STATE_VBLANK_PLUS_4;
          (e->state).ppu.state_ticks = 0x1c4;
          (e->state).ppu.stat.mode = PPU_MODE_VBLANK;
          break;
        case PPU_STATE_VBLANK_LY_0:
          (e->state).ppu.state = PPU_STATE_VBLANK_LY_0_PLUS_4;
          (e->state).ppu.state_ticks = 4;
          (e->state).ppu.ly = '\0';
          goto switchD_00110daf_default;
        case PPU_STATE_VBLANK_LY_0_PLUS_4:
          (e->state).ppu.state = PPU_STATE_VBLANK_LINE_Y_0;
          (e->state).ppu.state_ticks = 0x1c0;
          check_ly_eq_lyc(e,FALSE);
          break;
        case PPU_STATE_VBLANK_LINE_Y_0:
          (e->state).ppu.state = PPU_STATE_HBLANK_PLUS_4;
          (e->state).ppu.state_ticks = 4;
          (e->state).ppu.line_start_ticks = uVar8;
          (e->state).ppu.line_y = '\0';
          (e->state).ppu.win_y = '\0';
          (e->state).ppu.stat.mode2.trigger = TRUE;
          (e->state).ppu.stat.mode = PPU_MODE_HBLANK;
          (e->state).ppu.stat.trigger_mode = PPU_MODE_MODE2;
          break;
        case PPU_STATE_LCD_ON_MODE2:
        case PPU_STATE_MODE2:
          uVar7 = mode3_tick_count(e);
          uVar9 = (uint)((uVar7 & 3) == 0 && PVar5 != PPU_STATE_LCD_ON_MODE2);
          (e->state).ppu.state = PPU_STATE_MODE3 - uVar9;
          (e->state).ppu.state_ticks = uVar7 - uVar9 & 0xfffffffc;
          (e->state).ppu.stat.trigger_mode = PPU_MODE_MODE3;
          (e->state).ppu.stat.mode = PPU_MODE_MODE3;
          (e->state).ppu.mode3_render_ticks = uVar8;
          (e->state).ppu.render_x = '\0';
          (e->state).ppu.rendering_window = FALSE;
          break;
        case PPU_STATE_MODE3_EARLY_TRIGGER:
          (e->state).ppu.state = PPU_STATE_MODE3_COMMON;
          (e->state).ppu.state_ticks = 4;
          (e->state).ppu.stat.trigger_mode = PPU_MODE_HBLANK;
          break;
        case PPU_STATE_MODE3:
          (e->state).ppu.stat.trigger_mode = PPU_MODE_HBLANK;
        case PPU_STATE_MODE3_COMMON:
          ppu_mode3_synchronize(e);
          (e->state).ppu.state = PPU_STATE_HBLANK;
          (e->state).ppu.state_ticks = (int)(e->state).ppu.line_start_ticks + iVar11;
          (e->state).ppu.stat.mode = PPU_MODE_HBLANK;
          break;
        case PPU_STATE_COUNT:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                        ,0xe68,"void ppu_synchronize(Emulator *)");
        default:
          goto switchD_00110daf_default;
        }
        check_stat(e);
switchD_00110daf_default:
        (e->state).ppu.sync_ticks = uVar12;
        if ((e->state).ppu.lcdc.display == FALSE) {
          uVar8 = 0xffffffffffffffff;
        }
        else {
          uVar8 = (e->state).ppu.state_ticks + uVar12;
        }
        (e->state).ppu.next_intr_ticks = uVar8;
        uVar6 = (e->state).serial.next_intr_ticks;
        uVar10 = (e->state).timer.next_intr_ticks;
        if (uVar6 < uVar10) {
          uVar10 = uVar6;
        }
        if (uVar8 <= uVar10) {
          uVar10 = uVar8;
        }
        (e->state).next_intr_ticks = uVar10;
LAB_00110d78:
        iVar11 = iVar11 + -4;
        uVar8 = uVar12;
      } while (uVar12 != uVar13);
    }
    (e->state).ppu.sync_ticks = uVar13;
  }
  return;
}

Assistant:

static void ppu_synchronize(Emulator* e) {
  assert(IS_ALIGNED(PPU.sync_ticks, CPU_TICK));
  Ticks aligned_ticks = ALIGN_DOWN(TICKS, CPU_TICK);
  if (aligned_ticks > PPU.sync_ticks) {
    Ticks delta_ticks = aligned_ticks - PPU.sync_ticks;

    if (LCDC.display) {
      for (; delta_ticks > 0; delta_ticks -= CPU_TICK) {
        INTR.if_ |= (INTR.new_if & (IF_VBLANK | IF_STAT));
        STAT.mode2.trigger = FALSE;
        STAT.y_compare.trigger = FALSE;
        STAT.ly_eq_lyc = STAT.new_ly_eq_lyc;
        PPU.last_ly = PPU.ly;

        PPU.state_ticks -= CPU_TICK;
        if (LIKELY(PPU.state_ticks != 0)) {
          continue;
        }

        Ticks ticks = aligned_ticks - delta_ticks;

        switch (PPU.state) {
          case PPU_STATE_HBLANK:
          case PPU_STATE_VBLANK_PLUS_4:
            PPU.line_y++;
            PPU.ly++;
            PPU.line_start_ticks = ticks;
            check_ly_eq_lyc(e, FALSE);
            PPU.state_ticks = CPU_TICK;

            if (PPU.state == PPU_STATE_HBLANK) {
              STAT.mode2.trigger = TRUE;
              if (PPU.ly == SCREEN_HEIGHT) {
                PPU.state = PPU_STATE_VBLANK;
                STAT.trigger_mode = PPU_MODE_VBLANK;
                PPU.frame++;
                INTR.new_if |= IF_VBLANK;
                if (LIKELY(PPU.display_delay_frames == 0)) {
                  e->state.event |= EMULATOR_EVENT_NEW_FRAME;
                } else {
                  PPU.display_delay_frames--;
                }
              } else {
                PPU.state = PPU_STATE_HBLANK_PLUS_4;
                STAT.trigger_mode = PPU_MODE_MODE2;
                if (PPU.rendering_window) {
                  PPU.win_y++;
                }
                if (UNLIKELY(HDMA.mode == HDMA_TRANSFER_MODE_HDMA &&
                             (HDMA.blocks & 0x80) == 0)) {
                  HDMA.state = DMA_ACTIVE;
                }
              }
            } else {
              assert(PPU.state == PPU_STATE_VBLANK_PLUS_4);
              if (PPU.ly == SCREEN_HEIGHT_WITH_VBLANK - 1) {
                PPU.state = PPU_STATE_VBLANK_LY_0;
              } else {
                PPU.state_ticks = PPU_LINE_TICKS;
              }
            }
            check_stat(e);
            break;

          case PPU_STATE_HBLANK_PLUS_4:
            PPU.state = PPU_STATE_MODE2;
            PPU.state_ticks = PPU_MODE2_TICKS;
            STAT.mode = PPU_MODE_MODE2;
            do_ppu_mode2(e);
            break;

          case PPU_STATE_VBLANK:
            PPU.state = PPU_STATE_VBLANK_PLUS_4;
            PPU.state_ticks = PPU_LINE_TICKS - CPU_TICK;
            STAT.mode = PPU_MODE_VBLANK;
            check_stat(e);
            break;

          case PPU_STATE_VBLANK_LY_0:
            PPU.state = PPU_STATE_VBLANK_LY_0_PLUS_4;
            PPU.state_ticks = CPU_TICK;
            PPU.ly = 0;
            break;

          case PPU_STATE_VBLANK_LY_0_PLUS_4:
            PPU.state = PPU_STATE_VBLANK_LINE_Y_0;
            PPU.state_ticks = PPU_LINE_TICKS - CPU_TICK - CPU_TICK;
            check_ly_eq_lyc(e, FALSE);
            check_stat(e);
            break;

          case PPU_STATE_VBLANK_LINE_Y_0:
            PPU.state = PPU_STATE_HBLANK_PLUS_4;
            PPU.state_ticks = CPU_TICK;
            PPU.line_start_ticks = ticks;
            PPU.line_y = 0;
            PPU.win_y = 0;
            STAT.mode2.trigger = TRUE;
            STAT.mode = PPU_MODE_HBLANK;
            STAT.trigger_mode = PPU_MODE_MODE2;
            check_stat(e);
            break;

          case PPU_STATE_LCD_ON_MODE2:
          case PPU_STATE_MODE2:
            PPU.state_ticks = mode3_tick_count(e);
            if (PPU.state == PPU_STATE_LCD_ON_MODE2 ||
                (PPU.state_ticks & 3) != 0) {
              PPU.state = PPU_STATE_MODE3;
            } else {
              PPU.state = PPU_STATE_MODE3_EARLY_TRIGGER;
              PPU.state_ticks--;
            }
            PPU.state_ticks &= ~3;
            STAT.mode = STAT.trigger_mode = PPU_MODE_MODE3;
            PPU.mode3_render_ticks = ticks;
            PPU.render_x = 0;
            PPU.rendering_window = FALSE;
            check_stat(e);
            break;

          case PPU_STATE_MODE3_EARLY_TRIGGER:
            PPU.state = PPU_STATE_MODE3_COMMON;
            PPU.state_ticks = CPU_TICK;
            STAT.trigger_mode = PPU_MODE_HBLANK;
            check_stat(e);
            break;

          case PPU_STATE_MODE3:
            STAT.trigger_mode = PPU_MODE_HBLANK;
            /* fallthrough */

          case PPU_STATE_MODE3_COMMON:
            ppu_mode3_synchronize(e);
            PPU.state = PPU_STATE_HBLANK;
            PPU.state_ticks = PPU_LINE_TICKS + PPU.line_start_ticks - ticks;
            STAT.mode = PPU_MODE_HBLANK;
            check_stat(e);
            break;

          case PPU_STATE_COUNT:
            assert(0);
            break;
        }

        PPU.sync_ticks = ticks + CPU_TICK;
        calculate_next_ppu_intr(e);
      }
    }
    PPU.sync_ticks = aligned_ticks;
  }
}